

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

Vector3d * __thiscall
VCClusterQuad::center(Vector3d *__return_storage_ptr__,VCClusterQuad *this,Matrix4d *E)

{
  int iVar1;
  Vector3d x;
  Matrix<double,_3,_1,_0,_3,_1> MStack_28;
  
  iVar1 = (**(this->super_VCIQuad)._vptr_VCIQuad)(&this->super_VCIQuad,E,&MStack_28);
  if ((char)iVar1 == '\0') {
    VCCluster::center(__return_storage_ptr__,&this->super_VCCluster);
  }
  else {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(__return_storage_ptr__,&MStack_28);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d VCClusterQuad::center(const Matrix4d& E) {
	Vector3d x;
	if (solveQuadMetric(E, x))
		return x;
	return VCCluster::center();
}